

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMNormalizer::addOrChangeNamespaceDecl
          (DOMNormalizer *this,XMLCh *prefix,XMLCh *uri,DOMElementImpl *element)

{
  XMLCh *pXVar1;
  bool bVar2;
  XMLCh *pXVar3;
  undefined1 local_60 [8];
  XMLBuffer buf;
  DOMElementImpl *element_local;
  XMLCh *uri_local;
  XMLCh *prefix_local;
  DOMNormalizer *this_local;
  
  buf.fBuffer = (XMLCh *)element;
  bVar2 = XMLString::equals(prefix,L"");
  if (bVar2) {
    (**(code **)(*(long *)buf.fBuffer + 0x188))
              (buf.fBuffer,XMLUni::fgXMLNSURIName,XMLUni::fgXMLNSString,uri);
  }
  else {
    XMLBuffer::XMLBuffer((XMLBuffer *)local_60,0x3ff,this->fMemoryManager);
    XMLBuffer::set((XMLBuffer *)local_60,(XMLCh *)XMLUni::fgXMLNSString);
    XMLBuffer::append((XMLBuffer *)local_60,L':');
    XMLBuffer::append((XMLBuffer *)local_60,prefix);
    pXVar1 = buf.fBuffer;
    pXVar3 = XMLBuffer::getRawBuffer((XMLBuffer *)local_60);
    (**(code **)(*(long *)pXVar1 + 0x188))(pXVar1,XMLUni::fgXMLNSURIName,pXVar3,uri);
    XMLBuffer::~XMLBuffer((XMLBuffer *)local_60);
  }
  return;
}

Assistant:

void DOMNormalizer::addOrChangeNamespaceDecl(const XMLCh* prefix, const XMLCh* uri, DOMElementImpl* element) const {

    if (XMLString::equals(prefix, XMLUni::fgZeroLenString)) {
        element->setAttributeNS(XMLUni::fgXMLNSURIName, XMLUni::fgXMLNSString, uri);
    } else {
        XMLBuffer buf(1023, fMemoryManager);
        buf.set(XMLUni::fgXMLNSString);
        buf.append(chColon);
        buf.append(prefix);
        element->setAttributeNS(XMLUni::fgXMLNSURIName, buf.getRawBuffer(), uri);
    }
}